

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Inline_Array_AST_Node::eval_internal
          (Inline_Array_AST_Node *this,Dispatch_State *t_ss)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  bool bVar1;
  element_type *peVar2;
  Dispatch_Engine *t_conversions;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Dispatch_Engine *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  dispatch_error *anon_var_0;
  Boxed_Value obj;
  shared_ptr<chaiscript::AST_Node> *child;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range4;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> vec;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe68;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe70;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe98;
  Dispatch_State *in_stack_fffffffffffffea0;
  AST_Node *in_stack_fffffffffffffea8;
  Dispatch_Engine *pDVar4;
  allocator *params;
  element_type *t_name;
  undefined1 local_e0 [16];
  Dispatch_State local_d0;
  allocator local_a1;
  string local_a0 [64];
  reference local_60;
  shared_ptr<chaiscript::AST_Node> *local_58;
  __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_50;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *local_48;
  Dispatch_State *local_18;
  
  t_name = in_RDI;
  local_18 = in_RDX;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x24e226);
  bVar1 = std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::empty((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                   *)in_stack_fffffffffffffe80);
  if (!bVar1) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)&(in_RSI->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_parent,0);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24e256);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::size(&peVar2->children);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)&(in_RSI->m_conversions).m_conversions._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_parent,0);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24e28e);
    local_48 = &peVar2->children;
    local_50._M_current =
         (shared_ptr<chaiscript::AST_Node> *)
         std::
         vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
         ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)in_stack_fffffffffffffe68);
    local_58 = (shared_ptr<chaiscript::AST_Node> *)
               std::
               vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)in_stack_fffffffffffffe68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                               *)in_stack_fffffffffffffe68), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                 ::operator*(&local_50);
      std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x24e304);
      AST_Node::eval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x24e32b);
      if (bVar1) {
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                  (in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
      }
      else {
        t_conversions = chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x24e340);
        params = &local_a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"clone",params);
        in_stack_fffffffffffffea8 =
             (AST_Node *)
             &(in_RSI->m_conversions).m_convertableTypes._M_t._M_impl.super__Rb_tree_header;
        pDVar4 = (Dispatch_Engine *)local_e0;
        Boxed_Value::Boxed_Value
                  ((Boxed_Value *)in_stack_fffffffffffffe70,(Boxed_Value *)in_stack_fffffffffffffe68
                  );
        local_d0.m_stack_holder._M_data = (Stack_Holder *)0x1;
        local_d0.m_engine._M_data = pDVar4;
        std::allocator<chaiscript::Boxed_Value>::allocator
                  ((allocator<chaiscript::Boxed_Value> *)0x24e3c7);
        __l._M_len = (size_type)pDVar4;
        __l._M_array = (iterator)in_stack_fffffffffffffea8;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   in_stack_fffffffffffffea0,__l,in_stack_fffffffffffffe98);
        chaiscript::detail::Dispatch_State::conversions(local_18);
        chaiscript::detail::Dispatch_Engine::call_function
                  (in_RSI,(string *)t_name,(atomic_uint_fast32_t *)in_RDI,
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   params,(Type_Conversions_State *)t_conversions);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
                  (in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
        Boxed_Value::~Boxed_Value((Boxed_Value *)0x24e448);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  (in_stack_fffffffffffffe80);
        std::allocator<chaiscript::Boxed_Value>::~allocator
                  ((allocator<chaiscript::Boxed_Value> *)0x24e462);
        in_stack_fffffffffffffe98 = (allocator_type *)local_e0;
        in_stack_fffffffffffffea0 = &local_d0;
        do {
          in_stack_fffffffffffffea0 = (Dispatch_State *)&in_stack_fffffffffffffea0[-1].m_conversions
          ;
          Boxed_Value::~Boxed_Value((Boxed_Value *)0x24e48b);
        } while (in_stack_fffffffffffffea0 != (Dispatch_State *)in_stack_fffffffffffffe98);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x24e5ec);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
      ::operator++(&local_50);
    }
  }
  const_var<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (in_stack_fffffffffffffe68);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (in_stack_fffffffffffffe80);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = t_name;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          try {
            std::vector<Boxed_Value> vec;
            if (!children.empty()) {
              vec.reserve(children[0]->children.size());
              for (const auto &child : children[0]->children) {
                auto obj = child->eval(t_ss);
                if (!obj.is_return_value()) {
                  vec.push_back(t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions()));
                } else {
                  vec.push_back(std::move(obj));
                }
              }
            }
            return const_var(std::move(vec));
          }
          catch (const exception::dispatch_error &) {
            throw exception::eval_error("Can not find appropriate 'clone' or copy constructor for vector elements");
          }
        }